

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopFont(void)

{
  int iVar1;
  ImFontAtlas *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImFont **ppIVar5;
  
  pIVar3 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar3->FontStack).Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x370,"void ImVector<ImFont *>::pop_back() [T = ImFont *]");
  }
  uVar4 = iVar1 - 1;
  (pIVar3->FontStack).Size = uVar4;
  if (uVar4 == 0) {
    pIVar2 = (pIVar3->IO).Fonts;
    if ((pIVar2->Fonts).Size < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,"value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
    }
    ppIVar5 = (pIVar2->Fonts).Data;
  }
  else {
    ppIVar5 = (pIVar3->FontStack).Data + ((ulong)uVar4 - 1);
  }
  SetCurrentFont(*ppIVar5);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? g.IO.Fonts->Fonts[0] : g.FontStack.back());
}